

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_moveConstructionForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
TestBody(optTyped_moveConstructionForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
         *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_;
  type o2;
  AssertHelper local_38;
  Message local_30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  opt<long,_mp::opt_null_value_policy<long,__1L>_> local_18;
  
  local_18.storage_ = -1;
  local_30.ss_.ptr_._0_1_ = (internal)0x1;
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ss_.ptr_._0_1_ = (internal)0x1;
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::value(&local_18);
  }
  testing::Message::Message(&local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1c1,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_38,&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  local_38.data_ = (AssertHelperData *)local_18.storage_;
  if ((AssertHelperData *)local_18.storage_ == (AssertHelperData *)0xffffffffffffffff) {
    local_38.data_ =
         (AssertHelperData *)
         (this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_2;
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_30,"this->value_2","o2.value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_2,
             (long *)&local_38);
  if (local_30.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1c2,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_38.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_38.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_38.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, moveConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  auto o2{std::move(o1)};
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}